

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

bool testing::TestResult::ValidateTestProperty(string *xml_element,TestProperty *test_property)

{
  pointer pbVar1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  ulong uVar3;
  ostream *poVar4;
  long lVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  ulong uVar7;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_c0;
  allocator local_b1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b0;
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *local_98;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_88;
  ostream *local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_78;
  char *local_70;
  long local_68;
  char local_60 [16];
  string local_50;
  
  std::__cxx11::string::string((string *)&local_70,(test_property->key_)._M_dataplus._M_p,&local_b1)
  ;
  GetReservedAttributesForElement(&local_b0,xml_element);
  _Var2 = std::
          __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<std::__cxx11::string_const>>
                    (local_b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start,
                     local_b0.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish,&local_70);
  pbVar1 = local_b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar6 = local_b0.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (_Var2._M_current !=
      local_b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Message::Message((Message *)&local_90);
    local_98 = local_90._M_head_impl;
    poVar4 = (ostream *)(local_90._M_head_impl + 0x10);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,"Reserved key used in RecordProperty(): ",0x27);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,local_70,local_68);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
    local_78 = pbVar1;
    local_88 = _Var2._M_current;
    local_80 = poVar4;
    Message::Message((Message *)&local_c0);
    if ((long)local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start != 0) {
      uVar3 = (long)local_b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_b0.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5;
      poVar4 = (ostream *)(local_c0._M_head_impl + 0x10);
      lVar5 = 8;
      uVar7 = 0;
      do {
        if (2 < uVar3 && uVar7 != 0) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,", ",2);
        }
        if (uVar7 == ((long)local_b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)local_b0.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 5) - 1U) {
          std::__ostream_insert<char,std::char_traits<char>>(poVar4,"and ",4);
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar4,*(char **)((long)local_b0.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start + lVar5 + -8),
                   *(long *)((long)&((local_b0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p
                            + lVar5));
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
        uVar7 = uVar7 + 1;
        uVar3 = (long)local_b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)local_b0.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 5;
        lVar5 = lVar5 + 0x20;
      } while (uVar7 < uVar3);
    }
    internal::StringStreamToString(&local_50,local_c0._M_head_impl);
    poVar4 = local_80;
    if (local_c0._M_head_impl != (stringstream *)0x0) {
      (**(code **)(*(long *)local_c0._M_head_impl + 8))(local_c0._M_head_impl);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar4,local_50._M_dataplus._M_p,local_50._M_string_length);
    pbVar6 = local_78;
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," are reserved by ",0x11);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Google Test",0xb);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
    internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/coignetp[P]template-project-cpp/third_party/googletest/googletest/src/gtest.cc"
               ,0x86d,"Failed");
    _Var2._M_current = local_88;
    internal::AssertHelper::operator=((AssertHelper *)&local_c0,(Message *)&local_90);
    internal::AssertHelper::~AssertHelper((AssertHelper *)&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
    if (local_98 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      (**(code **)(*(long *)local_98 + 8))();
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_b0);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  return _Var2._M_current == pbVar6;
}

Assistant:

bool TestResult::ValidateTestProperty(const std::string& xml_element,
                                      const TestProperty& test_property) {
  return ValidateTestPropertyName(test_property.key(),
                                  GetReservedAttributesForElement(xml_element));
}